

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O3

void __thiscall
Arcflow::lift_state(Arcflow *this,vector<int,_std::allocator<int>_> *valid_opts,
                   vector<int,_std::allocator<int>_> *u,int it,int ic)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  int *piVar8;
  const_iterator __begin4;
  int *piVar9;
  const_iterator __end4;
  long lVar10;
  long *plVar11;
  long lVar12;
  vector<int,_std::allocator<int>_> *__range4;
  vector<int,_std::allocator<int>_> caps;
  vector<int,_std::allocator<int>_> space;
  vector<int,_std::allocator<int>_> local_98;
  int local_74;
  long local_70;
  long local_68;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  if (it < (this->inst).nsizes) {
    std::vector<int,_std::allocator<int>_>::vector
              (&local_48,(long)(this->inst).ndims,(allocator_type *)&local_60);
    if (0 < (this->inst).ndims) {
      piVar3 = (this->maxW).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (u->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      lVar10 = 0;
      do {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar10] = piVar3[lVar10] - piVar4[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 < (this->inst).ndims);
    }
    count_max_rep(&local_60,this,&local_48,it,ic);
    if (0 < (this->inst).ndims) {
      local_68 = (long)it + 1;
      local_70 = (long)it * 0x18;
      lVar10 = 0;
      do {
        iVar5 = (this->maxW).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        piVar9 = (valid_opts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (valid_opts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (piVar9 != piVar7) {
          piVar8 = piVar9;
          do {
            iVar1 = *(int *)(*(long *)&(this->inst).Ws.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[*piVar8].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + lVar10 * 4);
            if (iVar1 < iVar5) {
              iVar5 = iVar1;
            }
            piVar8 = piVar8 + 1;
          } while (piVar8 != piVar7);
        }
        piVar3 = (u->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start;
        iVar1 = piVar3[lVar10];
        if (iVar1 != iVar5) {
          iVar2 = (this->inst).nsizes;
          if ((it < iVar2) && (iVar1 <= iVar5)) {
            plVar11 = (long *)((long)&(((this->weights).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                      super__Vector_impl_data + local_70);
            lVar12 = local_68;
            do {
              iVar5 = iVar5 - *(int *)(*plVar11 + lVar10 * 4) *
                              local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar12 + -1];
              if (iVar2 <= lVar12) break;
              lVar12 = lVar12 + 1;
              plVar11 = plVar11 + 3;
            } while (iVar1 <= iVar5);
          }
          if (iVar5 < iVar1) {
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (int *)0x0;
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (int *)0x0;
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (int *)0x0;
            if (piVar9 != piVar7) {
              do {
                local_74 = *(int *)(*(long *)&(this->inst).Ws.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[*piVar9].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data + lVar10 * 4) -
                           (u->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[lVar10];
                if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (&local_98,
                             (iterator)
                             local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,&local_74);
                }
                else {
                  *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_74;
                  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                piVar4 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                piVar3 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                piVar9 = piVar9 + 1;
              } while (piVar9 != piVar7);
              uVar6 = (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2;
              if (1 < uVar6 &&
                  (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != 0) {
                lVar12 = 0x3f;
                if (uVar6 != 0) {
                  for (; uVar6 >> lVar12 == 0; lVar12 = lVar12 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (piVar3,piVar4);
                if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  piVar9 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + 1;
                  do {
                    piVar7 = piVar9;
                    if (piVar7 == local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish) goto LAB_0010b874;
                    piVar9 = piVar7 + 1;
                  } while (piVar7[-1] != *piVar7);
                  piVar8 = piVar7 + -1;
                  iVar5 = piVar7[-1];
                  for (; piVar9 != local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish; piVar9 = piVar9 + 1) {
                    iVar1 = *piVar9;
                    if (iVar5 != iVar1) {
                      piVar8[1] = iVar1;
                      piVar8 = piVar8 + 1;
                    }
                    iVar5 = iVar1;
                  }
                  if (piVar8 + 1 !=
                      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = piVar8 + 1;
                  }
                }
              }
            }
LAB_0010b874:
            iVar5 = min_slack(this,&local_60,it,(int)lVar10,&local_98);
            piVar9 = (u->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar10;
            *piVar9 = *piVar9 + iVar5;
            if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (int *)0x0) {
              operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          }
          else {
            piVar3[lVar10] = iVar5;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (this->inst).ndims);
    }
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Arcflow::lift_state(const std::vector<int> &valid_opts, std::vector<int> &u, int it,
						 int ic) const {
	if (it >= inst.nsizes) {
		return;
	}
	std::vector<int> space(inst.ndims);
	for (int d = 0; d < inst.ndims; d++) {
		space[d] = maxW[d] - u[d];
	}
	const std::vector<int> &r = count_max_rep(space, it, ic);
	for (int d = 0; d < inst.ndims; d++) {
		int minw = maxW[d];
		for (int t : valid_opts) {
			minw = std::min(minw, inst.Ws[t][d]);
		}
		if (u[d] != minw) {
			// lift method 1
			int maxpos = minw;
			for (int i = it; i < inst.nsizes && maxpos >= u[d]; i++) {
				maxpos -= r[i] * weights[i][d];
			}
			if (maxpos >= u[d]) {
				u[d] = maxpos;
			} else {
				// lift method 2
				std::vector<int> caps;
				for (int t : valid_opts) {
					caps.push_back(inst.Ws[t][d] - u[d]);
				}
				if (caps.size() > 1) {
					sort(all(caps));
					caps.erase(unique(all(caps)), caps.end());
				}
				u[d] += min_slack(r, it, d, caps);
			}
		}
	}
}